

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

iterator __thiscall
QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::insert
          (QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *this,GestureType *key,
          QFlags<Qt::GestureFlag> *value)

{
  long lVar1;
  bool bVar2;
  QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *in_RDI;
  long in_FS_OFFSET;
  QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> copy;
  iterator in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffc9;
  key_type *in_stack_ffffffffffffffd0;
  map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>
  *this_00;
  iterator local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>
             *)&DAT_aaaaaaaaaaaaaaaa;
  bVar2 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>_>
          ::isShared(&in_RDI->d);
  if (bVar2) {
    QMap(in_RDI,(QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *)in_stack_ffffffffffffff98._M_node
        );
  }
  else {
    memset(&stack0xffffffffffffffd8,0,8);
    QMap((QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *)0x38c392);
  }
  detach(in_RDI);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>_>
                *)0x38c3a6);
  std::
  map<Qt::GestureType,QFlags<Qt::GestureFlag>,std::less<Qt::GestureType>,std::allocator<std::pair<Qt::GestureType_const,QFlags<Qt::GestureFlag>>>>
  ::insert_or_assign<QFlags<Qt::GestureFlag>const&>
            (this_00,in_stack_ffffffffffffffd0,
             (QFlags<Qt::GestureFlag> *)
             CONCAT71(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8));
  iterator::iterator((iterator *)0x38c3f0,in_stack_ffffffffffffff98);
  ~QMap((QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *)0x38c3fa);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)(iterator)local_20._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator insert(const Key &key, const T &value)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        // TODO: improve. In case of assignment, why copying first?
        detach();
        return iterator(d->m.insert_or_assign(key, value).first);
    }